

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O3

Builder * arangodb::velocypack::Collection::appendArray(Builder *builder,Slice slice)

{
  ArrayIterator it;
  Slice local_40;
  ArrayIterator local_38;
  
  ArrayIterator::ArrayIterator(&local_38,slice);
  if (local_38._position != local_38._size) {
    do {
      local_40 = ArrayIterator::value(&local_38);
      Builder::addInternal<arangodb::velocypack::Slice>(builder,&local_40);
      ArrayIterator::next(&local_38);
    } while (local_38._position != local_38._size);
  }
  return builder;
}

Assistant:

Builder& Collection::appendArray(Builder& builder, Slice slice) {
  ArrayIterator it(slice);

  while (it.valid()) {
    builder.add(it.value());
    it.next();
  }

  return builder;
}